

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_materialized_collector.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalMaterializedCollector::GetGlobalSinkState
          (PhysicalMaterializedCollector *this,ClientContext *context)

{
  pointer pMVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::MaterializedCollectorGlobalState_*,_false> local_28;
  enable_shared_from_this<duckdb::ClientContext> local_20;
  
  make_uniq<duckdb::MaterializedCollectorGlobalState>();
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this(&local_20);
  pMVar1 = unique_ptr<duckdb::MaterializedCollectorGlobalState,_std::default_delete<duckdb::MaterializedCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorGlobalState,_std::default_delete<duckdb::MaterializedCollectorGlobalState>,_true>
                         *)&local_28);
  shared_ptr<duckdb::ClientContext,_true>::operator=
            (&pMVar1->context,(shared_ptr<duckdb::ClientContext,_true> *)&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_20.__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalMaterializedCollector::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<MaterializedCollectorGlobalState>();
	state->context = context.shared_from_this();
	return std::move(state);
}